

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandPlayerType::Tick
          (CommandPlayerType *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  PClassPlayerPawn *this_00;
  bool bVar1;
  uint uVar2;
  PClass **ppPVar3;
  uint local_28;
  uint i;
  bool hudChanged_local;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandPlayerType *this_local;
  
  SBarInfoCommandFlowControl::Tick
            (&this->super_SBarInfoCommandFlowControl,block,statusBar,hudChanged);
  if (((statusBar->super_DBaseStatusBar).CPlayer)->cls != (PClassPlayerPawn *)0x0) {
    for (local_28 = 0; uVar2 = TArray<const_PClass_*,_const_PClass_*>::Size(&this->classes),
        local_28 < uVar2; local_28 = local_28 + 1) {
      this_00 = ((statusBar->super_DBaseStatusBar).CPlayer)->cls;
      ppPVar3 = TArray<const_PClass_*,_const_PClass_*>::operator[](&this->classes,(ulong)local_28);
      bVar1 = PClass::IsDescendantOf((PClass *)this_00,*ppPVar3);
      if (bVar1) {
        SBarInfoCommandFlowControl::SetTruth
                  (&this->super_SBarInfoCommandFlowControl,true,block,statusBar);
        return;
      }
    }
    SBarInfoCommandFlowControl::SetTruth
              (&this->super_SBarInfoCommandFlowControl,false,block,statusBar);
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			if(statusBar->CPlayer->cls == NULL)
				return; //No class so we can not continue
		
			for(unsigned int i = 0;i < classes.Size();i++)
			{
				if (statusBar->CPlayer->cls->IsDescendantOf(classes[i]))
				{
					SetTruth(true, block, statusBar);
					return;
				}
			}
			SetTruth(false, block, statusBar);
		}